

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_backend.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_std::std_localization_backend::set_option
          (std_localization_backend *this,string *name,string *value)

{
  bool bVar1;
  value_type *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  in_RDI[9].field_0x4 = 1;
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(in_RDI[1].field_2._M_local_buf + 8),(string *)in_RDX)
    ;
  }
  else {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RSI,in_RDX);
    }
    else {
      bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
      if (bVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_RSI,in_RDX);
      }
      else {
        bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
        if (bVar1) {
          bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffd8);
          in_RDI[9].field_0x5 = bVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void set_option(std::string const &name,std::string const &value) 
        {
            invalid_ = true;
            if(name=="locale")
                locale_id_ = value;
            else if(name=="message_path")
                paths_.push_back(value);
            else if(name=="message_application")
                domains_.push_back(value);
            else if(name=="use_ansi_encoding")
                use_ansi_encoding_ = value == "true";

        }